

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

void __thiscall
inipp::Ini<char>::parse(Ini<char> *this,basic_istream<char,_std::char_traits<char>_> *is)

{
  element_type *peVar1;
  _Alloc_hider _Var2;
  int iVar3;
  istream *piVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  iterator iVar6;
  locale loc;
  String line;
  String value;
  String variable;
  String section;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  section._M_dataplus._M_p = (pointer)&section.field_2;
  section._M_string_length = 0;
  section.field_2._M_local_buf[0] = '\0';
  std::locale::locale(&loc,"C");
  do {
    while( true ) {
      do {
        do {
          piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)is,(string *)&line);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
            std::locale::~locale(&loc);
            std::__cxx11::string::~string((string *)&section);
            std::__cxx11::string::~string((string *)&line);
            return;
          }
          detail::ltrim<char>(&line,&loc);
          detail::rtrim<char>(&line,&loc);
        } while (line._M_string_length == 0);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<inipp::Ini<char>::parse(std::istream&)::_lambda(char)_1_>>
                          (line._M_dataplus._M_p,line._M_dataplus._M_p + line._M_string_length,this)
        ;
        _Var2 = line._M_dataplus;
        peVar1 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar3 = (*peVar1->_vptr_Format[3])(peVar1,(ulong)(uint)(int)*line._M_dataplus._M_p);
      } while ((char)iVar3 != '\0');
      peVar1 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (**peVar1->_vptr_Format)(peVar1,(ulong)(uint)(int)*_Var2._M_p);
      if ((char)iVar3 != '\0') break;
      if ((_Var5._M_current == line._M_dataplus._M_p) ||
         (_Var5._M_current == line._M_dataplus._M_p + line._M_string_length)) goto LAB_00107427;
      variable._M_dataplus._M_p = (pointer)&variable.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&variable,line._M_dataplus._M_p,_Var5._M_current);
      value._M_dataplus._M_p = (pointer)&value.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&value,_Var5._M_current + 1,line._M_dataplus._M_p + line._M_string_length
                );
      detail::rtrim<char>(&variable,&loc);
      detail::ltrim<char>(&value,&loc);
      this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[](&this->sections,&section);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00,&variable);
      if (iVar6._M_node == (_Base_ptr)(this_00 + 8)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>(this_00,&variable,&value);
      }
      else {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->errors,&line);
      }
      std::__cxx11::string::~string((string *)&value);
LAB_00107453:
      std::__cxx11::string::~string((string *)&variable);
    }
    peVar1 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar1->_vptr_Format[1])
                      (peVar1,(ulong)(uint)(int)line._M_dataplus._M_p[line._M_string_length - 1]);
    if ((char)iVar3 != '\0') {
      std::__cxx11::string::substr((ulong)&variable,(ulong)&line);
      std::__cxx11::string::operator=((string *)&section,(string *)&variable);
      goto LAB_00107453;
    }
LAB_00107427:
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->errors,&line);
  } while( true );
}

Assistant:

void parse(std::basic_istream<CharT> & is) {
		String line;
		String section;
		const std::locale loc{"C"};
		while (std::getline(is, line)) {
			detail::ltrim(line, loc);
			detail::rtrim(line, loc);
			const auto length = line.length();
			if (length > 0) {
				const auto pos = std::find_if(line.begin(), line.end(), [this](CharT ch) { return format->is_assign(ch); });
				const auto & front = line.front();
				if (format->is_comment(front)) {
				}
				else if (format->is_section_start(front)) {
					if (format->is_section_end(line.back()))
						section = line.substr(1, length - 2);
					else
						errors.push_back(line);
				}
				else if (pos != line.begin() && pos != line.end()) {
					String variable(line.begin(), pos);
					String value(pos + 1, line.end());
					detail::rtrim(variable, loc);
					detail::ltrim(value, loc);
					auto & sec = sections[section];
					if (sec.find(variable) == sec.end())
						sec.emplace(variable, value);
					else
						errors.push_back(line);
				}
				else {
					errors.push_back(line);
				}
			}
		}
	}